

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O2

void __thiscall TextReader::parse_quoted(TextReader *this,char quote_symbol)

{
  size_t sVar1;
  ulong uVar2;
  pointer pcVar3;
  long lVar4;
  size_t sVar5;
  allocator local_31;
  string local_30;
  
  uVar2 = (this->current_line_)._M_string_length;
  pcVar3 = (this->current_line_)._M_dataplus._M_p;
  sVar5 = this->current_token_len_ + 1;
  do {
    this->current_token_len_ = sVar5;
    if (uVar2 <= this->current_token_pos_ + sVar5) {
      std::__cxx11::string::string((string *)&local_30,"Missing closing quote symbol",&local_31);
      parse_error(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return;
    }
    sVar1 = sVar5 + 1;
    lVar4 = sVar5 + this->current_token_pos_;
    sVar5 = sVar1;
  } while (pcVar3[lVar4] != quote_symbol);
  this->current_token_len_ = sVar1;
  return;
}

Assistant:

inline void parse_quoted(const char quote_symbol) {
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
            (current_line_[current_token_pos_ + current_token_len_] != quote_symbol)) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            (current_line_[current_token_pos_ + current_token_len_] == quote_symbol)) {
            current_token_len_++;
        } else {
            parse_error(ERROR_MISSING_CLOSING_QUOTE);
        };
    }